

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaQProp.cpp
# Opt level: O0

void __thiscall NaQuickProp::UpdateNN(NaQuickProp *this)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  long *in_RDI;
  uint iLayer;
  uint iInput;
  NaStdBackProp *in_stack_00000110;
  NaStdBackProp *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_10;
  uint local_c;
  
  NaStdBackProp::UpdateNN(in_stack_00000110);
  NaPrintLog("NaQuickProp::UpdateNN():\n");
  local_10 = NaNeuralNetDescr::InputLayer
                       ((NaNeuralNetDescr *)((long)in_RDI + *(long *)(*in_RDI + -0x28) + 8));
  while( true ) {
    uVar1 = NaNeuralNetDescr::OutputLayer((NaNeuralNetDescr *)0x161213);
    if (uVar1 < local_10) break;
    local_c = 0;
    while( true ) {
      uVar1 = NaNeuralNetDescr::Inputs
                        ((NaNeuralNetDescr *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (uVar1 <= local_c) break;
      NaStdBackProp::nn(in_stack_ffffffffffffffd0);
      pNVar3 = NaNNUnit::Xinp((NaNNUnit *)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,(ulong)local_c);
      in_stack_ffffffffffffffd0 = *(NaStdBackProp **)CONCAT44(extraout_var,iVar2);
      puVar4 = (undefined8 *)
               (**(code **)(in_RDI[(ulong)local_10 * 3 + 1] + 0x40))
                         (in_RDI + (ulong)local_10 * 3 + 1,local_c);
      *puVar4 = in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd8 = local_10;
      in_stack_ffffffffffffffdc = local_c;
      puVar4 = (undefined8 *)
               (**(code **)(in_RDI[(ulong)local_10 * 3 + 1] + 0x40))
                         (in_RDI + (ulong)local_10 * 3 + 1,local_c);
      NaPrintLog((char *)*puVar4,"             %u:%u =%g\n",(ulong)in_stack_ffffffffffffffd8,
                 (ulong)in_stack_ffffffffffffffdc);
      local_c = local_c + 1;
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void    NaQuickProp::UpdateNN ()
{
    NaStdBackProp::UpdateNN();

    unsigned    iInput, /*iNeuron,*/ iLayer;

    // Store Xinp from previous step
    NaPrintLog("NaQuickProp::UpdateNN():\n");
    for(iLayer = nd.InputLayer(); iLayer <= nd.OutputLayer(); ++iLayer){
        for(iInput = 0; iInput < nd.Inputs(iLayer); ++iInput){
            Xinp_prev[iLayer][iInput] = nn().Xinp(iLayer)[iInput];
	    NaPrintLog("             %u:%u =%g\n",
		       iLayer, iInput, Xinp_prev[iLayer][iInput]);
        }
    }
}